

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_async.cpp
# Opt level: O2

void __thiscall Client::Client(Client *this,io_context *io_context,string *host,string *path)

{
  context *this_00;
  ostream *poVar1;
  allocator local_c9;
  error_code ec;
  string local_b8;
  string *local_98;
  results_type endpoints;
  resolver resolver;
  
  this->io_context_ = io_context;
  std::__cxx11::string::string((string *)&this->host_,(string *)host);
  std::__cxx11::string::string((string *)&this->path_,(string *)path);
  this_00 = &this->ssl_context_;
  local_98 = &this->path_;
  boost::asio::ssl::context::context(this_00,sslv23);
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::stream<boost::asio::io_context&>
            ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)&this->ssl_socket_,this->io_context_,this_00);
  boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (&this->request_,0xffffffffffffffff,(allocator<char> *)&resolver);
  std::vector<char,_std::allocator<char>_>::vector(&this->buffer_,0x400,(allocator_type *)&resolver)
  ;
  boost::asio::ssl::context::set_default_verify_paths(this_00);
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = boost::system::system_category();
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&resolver.impl_,this->io_context_,(type *)0x0);
  std::__cxx11::string::string((string *)&local_b8,"https",&local_c9);
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::resolve(&endpoints,&resolver,&this->host_,&local_b8,&ec);
  std::__cxx11::string::~string((string *)&local_b8);
  if (ec.failed_ == true) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Resolve failed: ");
    (*(ec.cat_)->_vptr_error_category[4])(&local_b8,ec.cat_,(ulong)(uint)ec.val_);
    poVar1 = std::operator<<(poVar1,(string *)&local_b8);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)ConnectHandler;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_allocated_capacity = (size_type)this;
    boost::asio::
    async_connect<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,std::_Bind<void(Client::*(Client*,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>)>>
              ((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)&this->ssl_socket_,&endpoints,
               (_Bind<void_(Client::*(Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(boost::system::error_code,_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>)>
                *)&local_b8,(type *)0x0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&endpoints.super_basic_resolver_iterator<boost::asio::ip::tcp>.values_.
              super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&resolver.impl_);
  return;
}

Assistant:

Client::Client(boost::asio::io_context& io_context,
               const std::string& host, const std::string& path)
    : io_context_(io_context),
      host_(host), path_(path),
      ssl_context_(ssl::context::sslv23),
      ssl_socket_(io_context_, ssl_context_),
      buffer_(1024) {

  // Use the default paths for finding CA certificates.
  ssl_context_.set_default_verify_paths();

  boost::system::error_code ec;

  // Get a list of endpoints corresponding to the server name.
  tcp::resolver resolver(io_context_);
  auto endpoints = resolver.resolve(host_, "https", ec);

  if (ec) {
    std::cerr << "Resolve failed: " << ec.message() << std::endl;
    return;
  }

  // ConnectHandler: void (boost::system::error_code, tcp::endpoint)
  boost::asio::async_connect(ssl_socket_.lowest_layer(), endpoints,
                             std::bind(&Client::ConnectHandler, this,
                                       std::placeholders::_1,
                                       std::placeholders::_2));
}